

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

char * bytes_to_hex(uint8_t *bytes,uint32_t size)

{
  uint local_2c;
  uint32_t i;
  char *hex_string;
  uint32_t size_local;
  uint8_t *bytes_local;
  
  bytes_local = (uint8_t *)calloc((ulong)(size * 2 + 1),1);
  if (bytes_local == (uint8_t *)0x0) {
    bytes_local = (uint8_t *)0x0;
  }
  else {
    for (local_2c = 0; local_2c < size; local_2c = local_2c + 1) {
      sprintf((char *)(bytes_local + (local_2c << 1)),"%02X",(ulong)bytes[local_2c]);
    }
  }
  return (char *)bytes_local;
}

Assistant:

static char *bytes_to_hex(uint8_t const *bytes, uint32_t size) {
    char *hex_string;
    MAYBE_CHECK_SIZE_OVERFLOW(size, SIZE_MAX / 2 - 1, NULL);

    hex_string = calloc((size * 2) + 1, sizeof(char));
    if (NULL == hex_string) {
        return NULL;
    }

    for (uint32_t i = 0; i < size; i++) {
        sprintf(hex_string + (2 * i), "%02X", bytes[i]);
    }

    return hex_string;
}